

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O0

int mg_node_equal(mg_node *lhs,mg_node *rhs)

{
  long lVar1;
  int iVar2;
  mg_map *in_RSI;
  long *in_RDI;
  uint32_t i;
  mg_string *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar3;
  int local_4;
  
  lVar1._0_4_ = in_RSI->size;
  lVar1._4_4_ = in_RSI->capacity;
  if (*in_RDI == lVar1) {
    if ((int)in_RDI[1] == *(int *)&in_RSI->keys) {
      for (uVar3 = 0; uVar3 < *(uint *)(in_RDI + 1); uVar3 = uVar3 + 1) {
        iVar2 = mg_string_equal(in_stack_ffffffffffffffd8,(mg_string *)0x111496);
        if (iVar2 == 0) {
          return 0;
        }
      }
      local_4 = mg_map_equal(in_RSI,(mg_map *)CONCAT44(uVar3,in_stack_ffffffffffffffe0));
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mg_node_equal(const mg_node *lhs, const mg_node *rhs) {
  if (lhs->id != rhs->id) {
    return 0;
  }
  if (lhs->label_count != rhs->label_count) {
    return 0;
  }
  for (uint32_t i = 0; i < lhs->label_count; ++i) {
    if (!mg_string_equal(lhs->labels[i], rhs->labels[i])) {
      return 0;
    }
  }
  return mg_map_equal(lhs->properties, rhs->properties);
}